

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O1

void __thiscall ON_LineCurve::ON_LineCurve(ON_LineCurve *this,ON_2dPoint *a,ON_2dPoint *b)

{
  double dVar1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  ON_3dPoint local_48;
  ON_3dPoint local_30;
  
  ON_Curve::ON_Curve(&this->super_ON_Curve);
  (this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object =
       (_func_int **)&PTR_ClassId_008219c8;
  ON_3dPoint::ON_3dPoint(&local_30,a);
  ON_3dPoint::ON_3dPoint(&local_48,b);
  from_pt.y = local_30.y;
  from_pt.x = local_30.x;
  from_pt.z = local_30.z;
  to_pt.y = local_48.y;
  to_pt.x = local_48.x;
  to_pt.z = local_48.z;
  ON_Line::ON_Line(&this->m_line,from_pt,to_pt);
  ON_Interval::ON_Interval(&this->m_t);
  this->m_dim = 2;
  dVar1 = ON_Line::Length(&this->m_line);
  ON_Interval::Set(&this->m_t,0.0,
                   (double)(~-(ulong)(2.3283064365386963e-10 < dVar1) & 0x3ff0000000000000 |
                           -(ulong)(2.3283064365386963e-10 < dVar1) & (ulong)dVar1));
  return;
}

Assistant:

ON_LineCurve::ON_LineCurve(const ON_2dPoint& a,const ON_2dPoint& b)
  : m_line(ON_3dPoint(a),ON_3dPoint(b))
  , m_dim(2)
{
  double len = m_line.Length();
  if ( len <= ON_ZERO_TOLERANCE )
    len = 1.0;
  m_t.Set(0.0,len);
}